

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

bool __thiscall QSplitter::isCollapsible(QSplitter *this,int index)

{
  QSplitterPrivate *pQVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  uint in_ESI;
  long in_FS_OFFSET;
  QSplitterPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  bool bVar4;
  bool local_29;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QSplitter *)0x69c899);
  bVar4 = true;
  if (-1 < (int)in_ESI) {
    in_stack_ffffffffffffffa8 = (char *)(long)(int)in_ESI;
    qVar2 = QList<QSplitterLayoutStruct_*>::size(&pQVar1->list);
    bVar4 = qVar2 <= (long)in_stack_ffffffffffffffa8;
  }
  if (bVar4 == false) {
    ppQVar3 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (qsizetype)in_stack_ffffffffffffff98);
    local_29 = ((byte)(*ppQVar3)->field_0x14 >> 1 & 3) != 0;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(bVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
               ,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_28,"QSplitter::isCollapsible: Index %d out of range",(ulong)in_ESI);
    local_29 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QSplitter::isCollapsible(int index) const
{
    Q_D(const QSplitter);
    if (Q_UNLIKELY(index < 0 || index >= d->list.size())) {
        qWarning("QSplitter::isCollapsible: Index %d out of range", index);
        return false;
    }
    return d->list.at(index)->collapsible;
}